

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_global_setup_locks_(int enable_locks)

{
  int iVar1;
  int local_c;
  int enable_locks_local;
  
  event_debug_map_lock_ = evthread_setup_global_lock_(event_debug_map_lock_,0,enable_locks);
  if (event_debug_map_lock_ == (void *)0x0) {
    event_warn("Couldn\'t allocate %s","event_debug_map_lock_");
    local_c = -1;
  }
  else {
    iVar1 = evsig_global_setup_locks_(enable_locks);
    if (iVar1 < 0) {
      local_c = -1;
    }
    else {
      iVar1 = evutil_global_setup_locks_(enable_locks);
      if (iVar1 < 0) {
        local_c = -1;
      }
      else {
        iVar1 = evutil_secure_rng_global_setup_locks_(enable_locks);
        if (iVar1 < 0) {
          local_c = -1;
        }
        else {
          local_c = 0;
        }
      }
    }
  }
  return local_c;
}

Assistant:

int
event_global_setup_locks_(const int enable_locks)
{
#ifndef EVENT__DISABLE_DEBUG_MODE
	EVTHREAD_SETUP_GLOBAL_LOCK(event_debug_map_lock_, 0);
#endif
	if (evsig_global_setup_locks_(enable_locks) < 0)
		return -1;
	if (evutil_global_setup_locks_(enable_locks) < 0)
		return -1;
	if (evutil_secure_rng_global_setup_locks_(enable_locks) < 0)
		return -1;
	return 0;
}